

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_bool32 ma_is_backend_enabled(ma_backend_conflict backend)

{
  ma_bool32 local_c;
  ma_backend_conflict backend_local;
  
  switch(backend) {
  case ma_backend_wasapi:
    local_c = 0;
    break;
  case ma_backend_dsound:
    local_c = 0;
    break;
  case ma_backend_winmm:
    local_c = 0;
    break;
  case ma_backend_coreaudio:
    local_c = 0;
    break;
  case ma_backend_sndio:
    local_c = 0;
    break;
  case ma_backend_audio4:
    local_c = 0;
    break;
  case ma_backend_oss:
    local_c = 0;
    break;
  case ma_backend_pulseaudio:
    local_c = 1;
    break;
  case ma_backend_alsa:
    local_c = 1;
    break;
  case ma_backend_jack:
    local_c = 1;
    break;
  case ma_backend_aaudio:
    local_c = 0;
    break;
  case ma_backend_opensl:
    local_c = 0;
    break;
  case ma_backend_webaudio:
    local_c = 0;
    break;
  case ma_backend_custom:
    local_c = 0;
    break;
  case ma_backend_null:
    local_c = 1;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

MA_API ma_bool32 ma_is_backend_enabled(ma_backend backend)
{
    /*
    This looks a little bit gross, but we want all backends to be included in the switch to avoid warnings on some compilers
    about some enums not being handled by the switch statement.
    */
    switch (backend)
    {
        case ma_backend_wasapi:
        #if defined(MA_HAS_WASAPI)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_dsound:
        #if defined(MA_HAS_DSOUND)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_winmm:
        #if defined(MA_HAS_WINMM)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_coreaudio:
        #if defined(MA_HAS_COREAUDIO)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_sndio:
        #if defined(MA_HAS_SNDIO)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_audio4:
        #if defined(MA_HAS_AUDIO4)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_oss:
        #if defined(MA_HAS_OSS)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_pulseaudio:
        #if defined(MA_HAS_PULSEAUDIO)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_alsa:
        #if defined(MA_HAS_ALSA)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_jack:
        #if defined(MA_HAS_JACK)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_aaudio:
        #if defined(MA_HAS_AAUDIO)
            #if defined(MA_ANDROID)
            {
                char sdkVersion[PROP_VALUE_MAX + 1] = {0, };
                if (__system_property_get("ro.build.version.sdk", sdkVersion)) {
                    if (atoi(sdkVersion) >= 26) {
                        return MA_TRUE;
                    } else {
                        return MA_FALSE;
                    }
                } else {
                    return MA_FALSE;
                }
            }
            #else
                return MA_FALSE;
            #endif
        #else
            return MA_FALSE;
        #endif
        case ma_backend_opensl:
        #if defined(MA_HAS_OPENSL)
            #if defined(MA_ANDROID)
            {
                char sdkVersion[PROP_VALUE_MAX + 1] = {0, };
                if (__system_property_get("ro.build.version.sdk", sdkVersion)) {
                    if (atoi(sdkVersion) >= 9) {
                        return MA_TRUE;
                    } else {
                        return MA_FALSE;
                    }
                } else {
                    return MA_FALSE;
                }
            }
            #else
                return MA_TRUE;
            #endif
        #else
            return MA_FALSE;
        #endif
        case ma_backend_webaudio:
        #if defined(MA_HAS_WEBAUDIO)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_custom:
        #if defined(MA_HAS_CUSTOM)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif
        case ma_backend_null:
        #if defined(MA_HAS_NULL)
            return MA_TRUE;
        #else
            return MA_FALSE;
        #endif

        default: return MA_FALSE;
    }
}